

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_fetch_backward_init(uchar **ppin,uchar *pinend,uint64_t *pval,uint *pbits)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  pbVar3 = *ppin;
  bVar1 = *pbVar3;
  if (bVar1 == 0) {
    iVar4 = 0;
  }
  else {
    uVar5 = (uint)pbVar3 & 3;
    lVar7 = -(ulong)uVar5;
    uVar6 = 0;
    pbVar9 = pbVar3;
    for (pbVar8 = pbVar3; ((ulong)pbVar8 & 3) != 0; pbVar8 = pbVar8 + -1) {
      uVar6 = uVar6 << 8 | (ulong)*pbVar9;
      pbVar9 = pbVar9 + -1;
    }
    bVar2 = pbVar3[lVar7];
    *ppin = pbVar3 + lVar7;
    *pval = (ulong)bVar2 | uVar6 << 8;
    *pbits = uVar5 * 8 + 8;
    elf_fetch_bits_backward(ppin,pinend,pval,pbits);
    uVar5 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    *pbits = (*pbits - (uVar5 ^ 0x1f)) + 0x17;
    elf_fetch_bits_backward(ppin,pinend,pval,pbits);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int
elf_fetch_backward_init (const unsigned char **ppin,
			 const unsigned char *pinend,
			 uint64_t *pval, unsigned int *pbits)
{
  const unsigned char *pin;
  unsigned int stream_start;
  uint64_t val;
  unsigned int bits;

  pin = *ppin;
  stream_start = (unsigned int)*pin;
  if (unlikely (stream_start == 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  val = 0;
  bits = 0;

  /* Align to a 32-bit boundary.  */
  while ((((uintptr_t)pin) & 3) != 0)
    {
      val <<= 8;
      val |= (uint64_t)*pin;
      bits += 8;
      --pin;
    }

  val <<= 8;
  val |= (uint64_t)*pin;
  bits += 8;

  *ppin = pin;
  *pval = val;
  *pbits = bits;
  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  *pbits -= __builtin_clz (stream_start) - (sizeof (unsigned int) - 1) * 8 + 1;

  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  return 1;
}